

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O3

int __thiscall cmCPackDebGenerator::PackageFiles(cmCPackDebGenerator *this)

{
  ComponentPackageMethod CVar1;
  int iVar2;
  string local_30;
  
  iVar2 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x19])();
  if ((char)iVar2 == '\0') {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"");
    iVar2 = PackageComponentsAllInOne(this,&local_30);
  }
  else {
    CVar1 = (this->super_cmCPackGenerator).componentPackageMethod;
    if (CVar1 != ONE_PACKAGE) {
      iVar2 = PackageComponents(this,CVar1 == ONE_PACKAGE_PER_COMPONENT);
      return iVar2;
    }
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"ALL_COMPONENTS_IN_ONE","");
    iVar2 = PackageComponentsAllInOne(this,&local_30);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return iVar2;
}

Assistant:

int cmCPackDebGenerator::PackageFiles()
{
  /* Are we in the component packaging case */
  if (this->WantsComponentInstallation()) {
    // CASE 1 : COMPONENT ALL-IN-ONE package
    // If ALL GROUPS or ALL COMPONENTS in ONE package has been requested
    // then the package file is unique and should be open here.
    if (this->componentPackageMethod == ONE_PACKAGE) {
      return this->PackageComponentsAllInOne("ALL_COMPONENTS_IN_ONE");
    }
    // CASE 2 : COMPONENT CLASSICAL package(s) (i.e. not all-in-one)
    // There will be 1 package for each component group
    // however one may require to ignore component group and
    // in this case you'll get 1 package for each component.
    return this->PackageComponents(this->componentPackageMethod ==
                                   ONE_PACKAGE_PER_COMPONENT);
  }
  // CASE 3 : NON COMPONENT package.
  return this->PackageComponentsAllInOne("");
}